

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateSamplerImpl<>
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,ISampler **ppSampler,
          SamplerDesc *SamplerDesc)

{
  anon_class_24_3_1f5b21c2 ConstructObject;
  SamplerDesc *SamplerDesc_local;
  ISampler **ppSampler_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  ConstructObject.SamplerDesc = SamplerDesc;
  ConstructObject.this = this;
  ConstructObject.ppSampler = (ISampler ***)&SamplerDesc_local;
  SamplerDesc_local = (SamplerDesc *)ppSampler;
  ppSampler_local = (ISampler **)this;
  CreateDeviceObject<Diligent::ISampler,Diligent::SamplerDesc,Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateSamplerImpl<>(Diligent::ISampler**,Diligent::SamplerDesc_const&)::_lambda()_1_>
            (this,"Sampler",SamplerDesc,ppSampler,ConstructObject);
  return;
}

Assistant:

void CreateSamplerImpl(ISampler** ppSampler, const SamplerDesc& SamplerDesc, const ExtraArgsType&... ExtraArgs)
    {
        CreateDeviceObject("Sampler", SamplerDesc, ppSampler,
                           [&]() //
                           {
                               RefCntAutoPtr<ISampler> pSampler = m_SamplersRegistry.Get(
                                   SamplerDesc,
                                   [&]() {
                                       return RefCntAutoPtr<ISampler>{NEW_RC_OBJ(m_SamplerObjAllocator, "Sampler instance", SamplerImplType)(static_cast<RenderDeviceImplType*>(this), SamplerDesc, ExtraArgs...)};
                                   });

                               *ppSampler = pSampler.Detach();
                           });
    }